

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool __thiscall
SingleNodeColumnSampler<double,_double>::sample_col
          (SingleNodeColumnSampler<double,_double> *this,size_t *col_chosen,
          Xoshiro256PP *rnd_generator)

{
  long lVar1;
  double dVar2;
  pointer puVar3;
  unsigned_long uVar4;
  size_type sVar5;
  result_type rVar6;
  double *pdVar7;
  runtime_error *this_00;
  ulong uVar8;
  size_t sVar9;
  size_t lev;
  result_type rVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  result_type_conflict1 rVar14;
  reference rVar15;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  size_type *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = col_chosen;
  if (this->using_tree == false) {
    if (this->backup_weights == true) {
      this->weights_orig =
           (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (this->n_inf != 0) {
      local_150._M_string_length = this->n_inf - 1;
      local_150._M_dataplus._M_p = (pointer)0x0;
      rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&local_150,rnd_generator);
      rVar10 = 0;
      for (uVar8 = 0; uVar8 < this->curr_pos; uVar8 = uVar8 + 1) {
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->inifinite_weights,this->col_indices[uVar8]);
        rVar10 = (rVar10 + 1) - (ulong)((rVar15._M_mask & *rVar15._M_p) == 0);
        if (rVar10 == rVar6) {
          *local_158 = this->col_indices[uVar8];
          this->n_inf = this->n_inf - 1;
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->inifinite_weights,*local_158);
          *rVar15._M_p = *rVar15._M_p & ~rVar15._M_mask;
          goto LAB_00163a1a;
        }
      }
    }
    if (this->n_left == 0) {
      return false;
    }
    dVar13 = this->cumw;
    if (dVar13 <= 0.0) {
      this->cumw = 0.0;
      dVar13 = 0.0;
      for (sVar9 = 0; this->curr_pos != sVar9; sVar9 = sVar9 + 1) {
        dVar13 = dVar13 + this->weights_orig[this->col_indices[sVar9]];
        this->cumw = dVar13;
      }
      if (dVar13 <= 0.0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Unexpected error in ",&local_159);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/utils.hpp"
                   ,&local_15a);
        std::operator+(&local_90,&local_b0,&local_d0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,":",&local_15b);
        std::operator+(&local_70,&local_90,&local_f0);
        std::__cxx11::to_string(&local_110,0x4c0);
        std::operator+(&local_50,&local_70,&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,&local_15c);
        std::operator+(&local_150,&local_50,&local_130);
        std::runtime_error::runtime_error(this_00,(string *)&local_150);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_150._M_dataplus._M_p = (pointer)0x0;
    local_150._M_string_length = (size_type)dVar13;
    rVar14 = std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)&local_150,rnd_generator);
    pdVar7 = this->weights_orig;
    dVar13 = 0.0;
    sVar9 = 0;
    do {
      if (this->curr_pos == sVar9) {
        sVar5 = this->col_indices[this->curr_pos - 1];
        *local_158 = sVar5;
        this->cumw = this->cumw - pdVar7[sVar5];
        pdVar7[sVar5] = 0.0;
        goto LAB_00163a1a;
      }
      sVar5 = this->col_indices[sVar9];
      dVar2 = pdVar7[sVar5];
      dVar13 = dVar13 + dVar2;
      sVar9 = sVar9 + 1;
    } while (dVar13 < rVar14);
    *local_158 = sVar5;
    this->cumw = this->cumw - dVar2;
    pdVar7[sVar5] = 0.0;
  }
  else {
    if (this->n_inf == 0) {
      if (this->n_left != 0) {
        pdVar7 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_150._M_string_length = (size_type)*pdVar7;
        if (0.0 < (double)local_150._M_string_length) {
          uVar8 = 0;
          for (uVar11 = 0; uVar11 < this->tree_levels; uVar11 = uVar11 + 1) {
            local_150._M_dataplus._M_p = (pointer)0x0;
            rVar14 = std::uniform_real_distribution<double>::operator()
                               ((uniform_real_distribution<double> *)&local_150,rnd_generator);
            pdVar7 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar8 = (uVar8 * 2 + 2) - (ulong)(rVar14 < pdVar7[uVar8 * 2 + 1]);
            local_150._M_string_length = (size_type)pdVar7[uVar8];
          }
          *local_158 = (this->mapped_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8 - this->offset];
          pdVar7[uVar8] = 0.0;
          sVar9 = this->tree_levels;
          while (bVar12 = sVar9 != 0, sVar9 = sVar9 - 1, bVar12) {
            lVar1 = uVar8 * 8;
            uVar8 = uVar8 - 1 >> 1;
            uVar11 = lVar1 - 8U | 8;
            pdVar7[uVar8] =
                 *(double *)((long)pdVar7 + uVar11) + *(double *)((long)pdVar7 + uVar11 + 8);
          }
          goto LAB_00163a1a;
        }
      }
      return false;
    }
    local_150._M_string_length = this->n_inf - 1;
    local_150._M_dataplus._M_p = (pointer)0x0;
    rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_150,rnd_generator);
    puVar3 = (this->mapped_inf_indices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *col_chosen = puVar3[rVar6];
    sVar9 = this->n_inf;
    this->n_inf = sVar9 - 1;
    uVar4 = puVar3[rVar6];
    puVar3[rVar6] = puVar3[sVar9 - 1];
    puVar3[sVar9 - 1] = uVar4;
  }
LAB_00163a1a:
  this->n_left = this->n_left - 1;
  return true;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::sample_col(size_t &col_chosen, RNG_engine &rnd_generator)
{
    if (!this->using_tree)
    {
        if (this->backup_weights)
            this->weights_orig = this->weights_own.data();

        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            size_t curr = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                curr += inifinite_weights[this->col_indices[col]];
                if (curr == chosen)
                {
                    col_chosen = this->col_indices[col];
                    this->n_inf--;
                    this->inifinite_weights[col_chosen] = false;
                    this->n_left--;
                    return true;
                }
            }
            assert(0);
        }

        if (!this->n_left) return false;

        /* due to the way this is calculated, there can be large roundoff errors and even negatives */
        if (this->cumw <= 0)
        {
            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
                this->cumw += this->weights_orig[this->col_indices[col]];
            if (unlikely(this->cumw <= 0))
                unexpected_error();
        }

        /* if there are no infinites, choose a column according to weight */
        ldouble_safe chosen = std::uniform_real_distribution<ldouble_safe>((ldouble_safe)0, this->cumw)(rnd_generator);
        ldouble_safe cumw_ = 0;
        for (size_t col = 0; col < this->curr_pos; col++)
        {
            cumw_ += this->weights_orig[this->col_indices[col]];
            if (cumw_ >= chosen)
            {
                col_chosen = this->col_indices[col];
                this->cumw -= this->weights_orig[col_chosen];
                this->weights_orig[col_chosen] = 0;
                this->n_left--;
                return true;
            }
        }
        col_chosen = this->col_indices[this->curr_pos-1];
        this->cumw -= this->weights_orig[col_chosen];
        this->weights_orig[col_chosen] = 0;
        this->n_left--;
        return true;
    }

    else
    {
        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            col_chosen = this->mapped_inf_indices[chosen];
            std::swap(this->mapped_inf_indices[chosen], this->mapped_inf_indices[--this->n_inf]);
            this->n_left--;
            return true;
        }

        else
        {
            /* TODO: should standardize all these tree traversals into one.
               This one in particular could do with sampling only a single
               random number as it will not typically require exhausting all
               options like the usual column sampler. */
            if (!this->n_left) return false;
            size_t curr_ix = 0;
            double rnd_subrange, w_left;
            double curr_subrange = this->tree_weights[0];
            if (curr_subrange <= 0)
                return false;

            for (size_t lev = 0; lev < tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = this->tree_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = this->tree_weights[curr_ix];
            }

            col_chosen = this->mapped_indices[curr_ix - this->offset];

            this->tree_weights[curr_ix] = 0.;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                this->tree_weights[curr_ix] =   this->tree_weights[ix_child(curr_ix)]
                                              + this->tree_weights[ix_child(curr_ix) + 1];
            }
            
            this->n_left--;
            return true;
        }
    }
}